

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict get_adjacent_member(node_t_conflict member,int next_p)

{
  int iVar1;
  node_t_conflict pnVar2;
  node_t_conflict local_20;
  node_t_conflict pnStack_10;
  int next_p_local;
  node_t_conflict member_local;
  
  pnStack_10 = member;
  if (member->code == N_MEMBER) {
    do {
      if (next_p == 0) {
        local_20 = DLIST_node_t_prev(pnStack_10);
      }
      else {
        local_20 = DLIST_node_t_next(pnStack_10);
      }
      pnStack_10 = local_20;
    } while ((local_20 != (node_t_conflict)0x0) &&
            ((local_20->code != N_MEMBER ||
             ((pnVar2 = DLIST_node_t_el(&(local_20->u).ops,1), pnVar2->code == N_IGNORE &&
              (iVar1 = anon_struct_union_type_member_p(local_20), iVar1 == 0))))));
    return local_20;
  }
  __assert_fail("member->code == N_MEMBER",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x1ca0,"node_t get_adjacent_member(node_t, int)");
}

Assistant:

static node_t get_adjacent_member (node_t member, int next_p) {
  assert (member->code == N_MEMBER);
  while ((member = next_p ? NL_NEXT (member) : NL_PREV (member)) != NULL)
    if (member->code == N_MEMBER
        && (NL_EL (member->u.ops, 1)->code != N_IGNORE || anon_struct_union_type_member_p (member)))
      break;
  return member;
}